

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O0

void Abc_NtkCountNodes(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *p;
  int iVar1;
  void *pvVar2;
  int local_2c;
  double dStack_28;
  int i;
  double Counter;
  Abc_Ntk_t *pModel;
  Vec_Ptr_t *vMods;
  Abc_Ntk_t *pNtk_local;
  
  if (pNtk->pDesign == (Abc_Des_t *)0x0) {
    iVar1 = Abc_NtkNodeNum(pNtk);
    dStack_28 = (double)iVar1;
  }
  else {
    p = pNtk->pDesign->vModules;
    for (local_2c = 0; iVar1 = Vec_PtrSize(p), local_2c < iVar1; local_2c = local_2c + 1) {
      pvVar2 = Vec_PtrEntry(p,local_2c);
      *(undefined8 *)((long)pvVar2 + 0xd0) = 0xbff0000000000000;
    }
    dStack_28 = Abc_NtkCountNodes_rec(pNtk);
  }
  printf("Nodes = %.0f\n",dStack_28);
  return;
}

Assistant:

void Abc_NtkCountNodes( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMods;
    Abc_Ntk_t * pModel;
    double Counter;
    int i;

    if ( pNtk->pDesign == NULL )
        Counter = Abc_NtkNodeNum(pNtk);
    else
    {
        vMods = pNtk->pDesign->vModules;
        Vec_PtrForEachEntry( Abc_Ntk_t *, vMods, pModel, i )
            pModel->dTemp = -1;
        Counter = Abc_NtkCountNodes_rec( pNtk );
    }
    printf( "Nodes = %.0f\n", Counter );
}